

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

int aom_compute_pyramid(YV12_BUFFER_CONFIG *frame,int bit_depth,int n_levels,ImagePyramid *pyr)

{
  pthread_mutex_t *in_RCX;
  int in_EDX;
  int result;
  ImagePyramid *in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000084;
  YV12_BUFFER_CONFIG *in_stack_00000088;
  int local_20;
  int local_1c;
  
  pthread_mutex_lock(in_RCX);
  local_20 = in_EDX;
  if (in_RCX[1].__data.__lock <= in_EDX) {
    local_20 = in_RCX[1].__data.__lock;
  }
  local_1c = local_20;
  if (*(int *)((long)in_RCX + 0x2c) < local_20) {
    local_1c = fill_pyramid(in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078)
    ;
  }
  pthread_mutex_unlock(in_RCX);
  return local_1c;
}

Assistant:

int aom_compute_pyramid(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                        int n_levels, ImagePyramid *pyr) {
  assert(pyr);

  // Per the comments in the ImagePyramid struct, we must take this mutex
  // before reading or writing the filled_levels field, and hold it while
  // computing any additional pyramid levels, to ensure proper behaviour
  // when multithreading is used
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD

  n_levels = AOMMIN(n_levels, pyr->max_levels);
  int result = n_levels;
  if (pyr->filled_levels < n_levels) {
    // Compute any missing levels that we need
    result = fill_pyramid(frame, bit_depth, n_levels, pyr);
  }

  // At this point, as long as result >= 0, the requested number of pyramid
  // levels are guaranteed to be valid, and can be safely read from without
  // holding the mutex any further
  assert(IMPLIES(result >= 0, pyr->filled_levels >= n_levels));
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
  return result;
}